

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbar.cpp
# Opt level: O1

bool __thiscall QToolBar::event(QToolBar *this,QEvent *event)

{
  ushort uVar1;
  QToolBarPrivate *this_00;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  char cVar8;
  bool bVar9;
  bool bVar10;
  undefined4 uVar11;
  uint uVar12;
  QStyle *pQVar13;
  QWidget *pQVar14;
  ulong uVar15;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar18 [16];
  QStyleOptionToolBar opt;
  ulong local_a0;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  QPalettePrivate *pQStack_60;
  undefined1 *local_58;
  QObject *pQStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_28;
  
  auVar6._8_8_ = local_98._8_8_;
  auVar6._0_8_ = local_98._0_8_;
  auVar7._8_8_ = local_98._8_8_;
  auVar7._0_8_ = local_98._0_8_;
  auVar5._8_8_ = local_98._8_8_;
  auVar5._0_8_ = local_98._0_8_;
  auVar4._8_8_ = local_98._8_8_;
  auVar4._0_8_ = local_98._0_8_;
  auVar3._8_8_ = local_98._8_8_;
  auVar3._0_8_ = local_98._0_8_;
  auVar2._8_8_ = local_98._8_8_;
  auVar2._0_8_ = local_98._0_8_;
  auVar18._8_8_ = local_98._8_8_;
  auVar18._0_8_ = local_98._0_8_;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QToolBarPrivate **)&(this->super_QWidget).field_0x8;
  uVar1 = *(ushort *)(event + 8);
  bVar10 = true;
  if (0x11 < uVar1) {
    if (uVar1 < 0x7f) {
      if (uVar1 == 0x12) {
        if ((((this->super_QWidget).data)->widget_attributes & 0x10000) != 0) goto LAB_004b62f8;
      }
      else {
        local_98 = auVar3;
        if (uVar1 == 0x15) {
          QToolBarLayout::checkUsePopupMenu(this_00->layout);
        }
      }
    }
    else {
      if (uVar1 - 0x7f < 2) goto LAB_004b6381;
      local_98 = auVar2;
      if (uVar1 == 0x81) {
        local_38 = &DAT_aaaaaaaaaaaaaaaa;
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        pQStack_50 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        pQStack_60 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
        local_78 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
        local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QStyleOptionToolBar::QStyleOptionToolBar((QStyleOptionToolBar *)local_88);
        (**(code **)(*(long *)&this->super_QWidget + 0x1a0))(this,(QStyleOptionToolBar *)local_88);
        pQVar13 = QWidget::style(&this->super_QWidget);
        local_98 = (**(code **)(*(long *)pQVar13 + 0xc0))
                             (pQVar13,0x34,(QStyleOptionToolBar *)local_88,this);
        uVar11 = QEventPoint::position();
        auVar16._0_8_ =
             (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
             extraout_XMM1_Qa;
        auVar16._8_8_ =
             (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
             extraout_XMM0_Qa;
        auVar18 = minpd(_DAT_0066f5d0,auVar16);
        auVar17._8_8_ = -(ulong)(-2147483648.0 < auVar18._8_8_);
        auVar17._0_8_ = -(ulong)(-2147483648.0 < auVar18._0_8_);
        uVar12 = movmskpd(uVar11,auVar17);
        uVar15 = 0x8000000000000000;
        if ((uVar12 & 1) != 0) {
          uVar15 = (ulong)(uint)(int)auVar18._0_8_ << 0x20;
        }
        local_a0 = 0x80000000;
        if ((uVar12 & 2) != 0) {
          local_a0 = (ulong)(uint)(int)auVar18._8_8_;
        }
        local_a0 = local_a0 | uVar15;
        cVar8 = QRect::contains((QPoint *)local_98,SUB81(&local_a0,0));
        if (cVar8 == '\0') {
          QWidget::unsetCursor(&this->super_QWidget);
        }
        else {
          QCursor::QCursor((QCursor *)local_98,SizeAllCursor);
          QWidget::setCursor(&this->super_QWidget,(QCursor *)local_98);
          QCursor::~QCursor((QCursor *)local_98);
        }
        QStyleOption::~QStyleOption((QStyleOption *)local_88);
      }
    }
    goto switchD_004b6097_caseD_4;
  }
  local_98 = auVar18;
  switch(uVar1) {
  case 1:
    local_98 = auVar7;
    if ((this_00->waitForPopupTimer).m_id == *(TimerId *)(event + 0x10)) {
      pQVar14 = QApplication::activePopupWidget();
      bVar10 = waitForPopup(this,pQVar14);
      if (!bVar10) {
        QBasicTimer::stop();
        if ((((this->super_QWidget).data)->widget_attributes & 2) == 0) goto LAB_004b6366;
      }
    }
    break;
  case 2:
    bVar9 = QToolBarPrivate::mousePressEvent(this_00,(QMouseEvent *)event);
    goto LAB_004b62e1;
  case 3:
    bVar9 = QToolBarPrivate::mouseReleaseEvent(this_00,(QMouseEvent *)event);
    goto LAB_004b62e1;
  case 4:
  case 6:
  case 7:
  case 8:
  case 9:
  case 10:
    break;
  case 5:
    bVar9 = QToolBarPrivate::mouseMoveEvent(this_00,(QMouseEvent *)event);
LAB_004b62e1:
    auVar6._8_8_ = local_98._8_8_;
    auVar6._0_8_ = local_98._0_8_;
    local_98 = auVar6;
    if (bVar9 != false) goto LAB_004b6381;
    break;
  case 0xb:
    if (((this_00->state == (DragState *)0x0) ||
        (local_98 = auVar4, this_00->state->dragging == false)) &&
       (local_98 = auVar5, (this_00->layout->super_QLayout).super_QLayoutItem.field_0xc == '\x01'))
    {
      pQVar14 = QApplication::activePopupWidget();
      bVar10 = waitForPopup(this,pQVar14);
      if (bVar10) {
        QBasicTimer::start(&this_00->waitForPopupTimer,500000000,1,this);
      }
      else {
        QBasicTimer::stop();
LAB_004b6366:
        QToolBarLayout::setExpanded(this_00->layout,false);
      }
    }
    break;
  default:
    local_98 = auVar6;
    if (uVar1 == 0x11) {
LAB_004b62f8:
      QAction::setChecked(SUB81(this_00->toggleViewAction,0));
      local_88._8_8_ = local_98;
      local_98[0] = *(short *)(event + 8) == 0x11;
      local_88._0_8_ = (undefined1 *)0x0;
      QMetaObject::activate((QObject *)this,&staticMetaObject,7,(void **)local_88);
    }
  }
switchD_004b6097_caseD_4:
  bVar10 = QWidget::event(&this->super_QWidget,event);
  auVar6 = local_98;
LAB_004b6381:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    local_98 = auVar6;
    __stack_chk_fail();
  }
  return bVar10;
}

Assistant:

bool QToolBar::event(QEvent *event)
{
    Q_D(QToolBar);

    switch (event->type()) {
    case QEvent::Timer:
        if (d->waitForPopupTimer.timerId() == static_cast<QTimerEvent*>(event)->timerId()) {
            QWidget *w = QApplication::activePopupWidget();
            if (!waitForPopup(this, w)) {
                d->waitForPopupTimer.stop();
                if (!this->underMouse())
                    d->layout->setExpanded(false);
            }
        }
        break;
    case QEvent::Hide:
        if (!isHidden())
            break;
        Q_FALLTHROUGH();
    case QEvent::Show:
        d->toggleViewAction->setChecked(event->type() == QEvent::Show);
#ifdef Q_OS_MACOS
        enableMacToolBar(this, event->type() == QEvent::Show);
#endif
        emit visibilityChanged(event->type() == QEvent::Show);
        break;
    case QEvent::ParentChange:
        d->layout->checkUsePopupMenu();
        break;

    case QEvent::MouseButtonPress: {
        if (d->mousePressEvent(static_cast<QMouseEvent*>(event)))
            return true;
        break;
    }
    case QEvent::MouseButtonRelease:
        if (d->mouseReleaseEvent(static_cast<QMouseEvent*>(event)))
            return true;
        break;
    case QEvent::HoverEnter:
    case QEvent::HoverLeave:
        // there's nothing special to do here and we don't want to update the whole widget
        return true;
    case QEvent::HoverMove: {
#ifndef QT_NO_CURSOR
        QHoverEvent *e = static_cast<QHoverEvent*>(event);
        QStyleOptionToolBar opt;
        initStyleOption(&opt);
        if (style()->subElementRect(QStyle::SE_ToolBarHandle, &opt, this).contains(e->position().toPoint()))
            setCursor(Qt::SizeAllCursor);
        else
            unsetCursor();
#endif
        break;
    }
    case QEvent::MouseMove:
        if (d->mouseMoveEvent(static_cast<QMouseEvent*>(event)))
            return true;
        break;
    case QEvent::Leave:
        if (d->state != nullptr && d->state->dragging) {
#ifdef Q_OS_WIN
            // This is a workaround for losing the mouse on Vista.
            QPoint pos = QCursor::pos();
            QMouseEvent fake(QEvent::MouseMove, mapFromGlobal(pos), pos, Qt::NoButton,
                             QGuiApplication::mouseButtons(), QGuiApplication::keyboardModifiers());
            d->mouseMoveEvent(&fake);
#endif
        } else {
            if (!d->layout->expanded)
                break;

            QWidget *w = QApplication::activePopupWidget();
            if (waitForPopup(this, w)) {
                d->waitForPopupTimer.start(POPUP_TIMER_INTERVAL, this);
                break;
            }

            d->waitForPopupTimer.stop();
            d->layout->setExpanded(false);
            break;
        }
        break;
    default:
        break;
    }
    return QWidget::event(event);
}